

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_count.cpp
# Opt level: O3

void duckdb::ApproxCountDistinctSimpleUpdateFunction
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,data_ptr_t state,
               idx_t count)

{
  InternalException *this;
  Vector hash_vec;
  LogicalType LStack_a8;
  Vector local_90;
  
  if (count < 0x801) {
    LogicalType::LogicalType(&LStack_a8,UBIGINT);
    Vector::Vector(&local_90,&LStack_a8,count);
    LogicalType::~LogicalType(&LStack_a8);
    VectorOperations::Hash(inputs,&local_90,count);
    HyperLogLog::Update((HyperLogLog *)state,inputs,&local_90,count);
    if (local_90.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_90.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)((long)&local_90 + 8));
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_90._0_8_ = &local_90.type.type_info_;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"ApproxCountDistinct - count must be at most vector size","");
  InternalException::InternalException(this,(string *)&local_90);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void ApproxCountDistinctSimpleUpdateFunction(Vector inputs[], AggregateInputData &, idx_t input_count,
                                                    data_ptr_t state, idx_t count) {
	D_ASSERT(input_count == 1);
	auto &input = inputs[0];

	if (count > STANDARD_VECTOR_SIZE) {
		throw InternalException("ApproxCountDistinct - count must be at most vector size");
	}
	Vector hash_vec(LogicalType::HASH, count);
	VectorOperations::Hash(input, hash_vec, count);

	auto agg_state = reinterpret_cast<ApproxDistinctCountState *>(state);
	agg_state->hll.Update(input, hash_vec, count);
}